

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

attributes_t * __thiscall
tchecker::syncprod::synchronizer_t::attributes
          (attributes_t *__return_storage_ptr__,synchronizer_t *this,state_t *state)

{
  bool bVar1;
  no_storage_array_t<unsigned_int> *pnVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
  _Var3;
  make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL> *pmVar4;
  uint uVar5;
  range_t<tchecker::system::attributes_t::const_iterator_t,_tchecker::system::attributes_t::const_iterator_t>
  rVar6;
  allocator<char> local_e2;
  allocator<char> local_e1;
  attributes_t *local_e0;
  intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_> *local_d8;
  synchronizer_t *local_d0;
  no_storage_array_t<unsigned_int> *local_c8;
  no_storage_array_t<unsigned_int> *local_c0;
  undefined1 local_b8 [32];
  _Alloc_hider local_98;
  pointer pvStack_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_map)._M_h._M_buckets =
       &(__return_storage_ptr__->_map)._M_h._M_single_bucket;
  (__return_storage_ptr__->_map)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->_map)._M_h._M_element_count = 0;
  (__return_storage_ptr__->_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_e0 = __return_storage_ptr__;
  local_d8 = &state->_vloc;
  local_d0 = this;
  pnVar2 = (no_storage_array_t<unsigned_int> *)
           intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator*(&state->_vloc);
  local_c8 = pnVar2 + (ulong)*(uint *)pnVar2 + 1;
  uVar5 = 0;
  while (pnVar2 + 1 != local_c8) {
    local_c0 = pnVar2 + 1;
    tchecker::system::locs_t::location
              ((locs_t *)local_b8,
               (int)(local_d0->_system).
                    super___shared_ptr<const_tchecker::syncprod::system_t,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr + 0x230);
    rVar6 = tchecker::system::attributes_t::range((attributes_t *)(local_b8._0_8_ + 0x28));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_b8 + 8));
    for (_Var3._M_cur = (__node_type *)
                        rVar6._begin.super_const_iterator.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
                        ._M_cur; pnVar2 = local_c0,
        _Var3._M_cur !=
        (__node_type *)
        rVar6._end.super_const_iterator.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_true>
        ._M_cur; _Var3._M_cur = *_Var3._M_cur) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)_Var3._M_cur + 0x28),"initial");
      if (bVar1) {
        uVar5 = uVar5 + 1;
      }
      else {
        tchecker::system::attr_parsing_position_t::attr_parsing_position_t
                  ((attr_parsing_position_t *)local_b8,
                   (attr_parsing_position_t *)((long)_Var3._M_cur + 0x68));
        tchecker::system::attributes_t::add_attribute
                  (local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)_Var3._M_cur + 0x28),(string *)((long)_Var3._M_cur + 0x48),
                   (attr_parsing_position_t *)local_b8);
        parsing::attr_parsing_position_t::~attr_parsing_position_t
                  ((attr_parsing_position_t *)local_b8);
      }
    }
  }
  pmVar4 = intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::vloc_t,_unsigned_long,_1UL>_>::
           operator*(local_d8);
  if (uVar5 == (pmVar4->super_vloc_t).super_loc_array_t.super_vloc_base_t.
               super_array_capacity_t<unsigned_int>._capacity) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"initial",&local_e1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_e2);
    local_88._M_allocated_capacity = 0;
    local_88._8_8_ = (pointer)0x0;
    local_98._M_p = (pointer)0x0;
    pvStack_90 = (pointer)0x0;
    local_b8._16_8_ = (pointer)0x0;
    local_b8._24_8_ = (pointer)0x0;
    local_b8._0_8_ = (pointer)0x0;
    local_b8._8_8_ = (pointer)0x0;
    parsing::attr_parsing_position_t::attr_parsing_position_t((attr_parsing_position_t *)local_b8);
    tchecker::system::attributes_t::add_attribute
              (local_e0,&local_50,&local_70,(attr_parsing_position_t *)local_b8);
    parsing::attr_parsing_position_t::~attr_parsing_position_t((attr_parsing_position_t *)local_b8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
  }
  return local_e0;
}

Assistant:

tchecker::system::attributes_t attributes(tchecker::syncprod::state_t const & state)
  {
    tchecker::process_id_t count_initial = 0;
    tchecker::system::attributes_t attributes;
    for (tchecker::loc_id_t id : state.vloc())
      for (auto && attr : _system->location(id)->attributes().range()) {
        if (attr.key() == "initial")
          ++count_initial;
        else
          attributes.add_attribute(attr.key(), attr.value(), attr.parsing_position());
      }
    if (count_initial == state.vloc().size()) // all processes initial
      attributes.add_attribute("initial", "", tchecker::system::attr_parsing_position_t{});
    return attributes;
  }